

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_req.cxx
# Opt level: O2

ptr<snapshot_sync_req> __thiscall
cornerstone::snapshot_sync_req::deserialize(snapshot_sync_req *this,buffer *buf)

{
  byte *__src;
  size_t sVar1;
  size_t sVar2;
  byte *__dest;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<snapshot_sync_req> pVar3;
  bool done;
  bufptr b;
  ulong offset;
  ptr<snapshot> snp;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> local_48;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  snapshot::deserialize
            ((snapshot *)
             &local_38._M_t.
              super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
              super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
              super__Head_base<0UL,_cornerstone::buffer_*,_false>,buf);
  local_38._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)buffer::get_ulong(buf);
  buffer::get_byte(buf);
  __src = buffer::data(buf);
  sVar1 = buffer::pos(buf);
  sVar2 = buffer::size(buf);
  if (sVar1 < sVar2) {
    sVar1 = buffer::size(buf);
    sVar2 = buffer::pos(buf);
    buffer::alloc((buffer *)&local_48,sVar1 - sVar2);
    __dest = buffer::data(local_48._M_t.
                          super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>
                          ._M_t.
                          super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>
                          .super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl);
    memcpy(__dest,__src,sVar1 - sVar2);
    std::
    make_shared<cornerstone::snapshot_sync_req,std::shared_ptr<cornerstone::snapshot>&,unsigned_long&,std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,bool&>
              (&this->snapshot_,
               (unsigned_long *)
               &local_38._M_t.
                super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
                super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
                super__Head_base<0UL,_cornerstone::buffer_*,_false>,&local_38,(bool *)&local_48);
  }
  else {
    buffer::alloc((buffer *)&local_48,0);
    std::
    make_shared<cornerstone::snapshot_sync_req,std::shared_ptr<cornerstone::snapshot>&,unsigned_long&,std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,bool&>
              (&this->snapshot_,
               (unsigned_long *)
               &local_38._M_t.
                super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
                super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
                super__Head_base<0UL,_cornerstone::buffer_*,_false>,&local_38,(bool *)&local_48);
  }
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  pVar3.super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar3.super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this
  ;
  return (ptr<snapshot_sync_req>)
         pVar3.super___shared_ptr<cornerstone::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot_sync_req> snapshot_sync_req::deserialize(buffer& buf)
{
    ptr<snapshot> snp(snapshot::deserialize(buf));
    ulong offset = buf.get_ulong();
    bool done = buf.get_byte() == 1;
    byte* src = buf.data();
    if (buf.pos() < buf.size())
    {
        size_t sz = buf.size() - buf.pos();
        bufptr b = buffer::alloc(sz);
        ::memcpy(b->data(), src, sz);
        return cs_new<snapshot_sync_req>(snp, offset, std::move(b), done);
    }
    else
    {
        return cs_new<snapshot_sync_req>(snp, offset, buffer::alloc(0), done);
    }
}